

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O2

void __thiscall lscpp::comm_logger::open_in(comm_logger *this)

{
  int __oflag;
  allocator<char> local_31;
  string local_30 [32];
  
  if (this->file_open_ == false) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,".in",&local_31);
    open(this,(char *)local_30,__oflag);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void comm_logger::open_in() {
  if (!file_open_)
    open(".in");
}